

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.cpp
# Opt level: O1

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::~VulkanSyncObjectManager(VulkanSyncObjectManager *this)

{
  _Atomic_word *p_Var1;
  pointer ppVVar2;
  pointer ppVVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  pointer ppVVar6;
  pointer ppVVar7;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->m_SemaphorePoolGuard);
  if (iVar5 == 0) {
    ppVVar2 = (this->m_SemaphorePool).
              super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppVVar6 = (this->m_SemaphorePool).
                   super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppVVar6 != ppVVar2; ppVVar6 = ppVVar6 + 1) {
      (*vkDestroySemaphore)(this->m_LogicalDevice->m_VkDevice,*ppVVar6,(VkAllocationCallbacks *)0x0)
      ;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_SemaphorePoolGuard);
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->m_FencePoolGuard);
    if (iVar5 == 0) {
      ppVVar3 = (this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppVVar7 = (this->m_FencePool).
                     super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>._M_impl.
                     super__Vector_impl_data._M_start; ppVVar7 != ppVVar3; ppVVar7 = ppVVar7 + 1) {
        (*vkDestroyFence)(this->m_LogicalDevice->m_VkDevice,*ppVVar7,(VkAllocationCallbacks *)0x0);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_FencePoolGuard);
      ppVVar7 = (this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppVVar7 != (pointer)0x0) {
        operator_delete(ppVVar7,(long)(this->m_FencePool).
                                      super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ppVVar7);
      }
      ppVVar6 = (this->m_SemaphorePool).
                super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppVVar6 != (pointer)0x0) {
        operator_delete(ppVVar6,(long)(this->m_SemaphorePool).
                                      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ppVVar6);
      }
      p_Var4 = (this->super_enable_shared_from_this<VulkanUtilities::VulkanSyncObjectManager>).
               _M_weak_this.
               super___weak_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &p_Var4->_M_weak_count;
          iVar5 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar5 = p_Var4->_M_weak_count;
          p_Var4->_M_weak_count = iVar5 + -1;
        }
        if (iVar5 == 1) {
          (*p_Var4->_vptr__Sp_counted_base[3])();
          return;
        }
      }
      return;
    }
  }
  std::__throw_system_error(iVar5);
}

Assistant:

VulkanSyncObjectManager::~VulkanSyncObjectManager()
{
    {
        std::lock_guard<std::mutex> Lock{m_SemaphorePoolGuard};

        for (auto vkSem : m_SemaphorePool)
        {
            vkDestroySemaphore(m_LogicalDevice.GetVkDevice(), vkSem, nullptr);
        }
    }
    {
        std::lock_guard<std::mutex> Lock{m_FencePoolGuard};

        for (auto vkFence : m_FencePool)
        {
            vkDestroyFence(m_LogicalDevice.GetVkDevice(), vkFence, nullptr);
        }
    }
}